

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sampler_border_color_component_mapping
          (Impl *this,Value *state,VkSamplerBorderColorComponentMappingCreateInfoEXT **out_info)

{
  uint uVar1;
  VkComponentSwizzle VVar2;
  VkSamplerBorderColorComponentMappingCreateInfoEXT *pVVar3;
  Type pGVar4;
  GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
  *pGVar5;
  VkSamplerBorderColorComponentMappingCreateInfoEXT *info;
  VkSamplerBorderColorComponentMappingCreateInfoEXT **out_info_local;
  Value *state_local;
  Impl *this_local;
  
  pVVar3 = ScratchAllocator::allocate_cleared<VkSamplerBorderColorComponentMappingCreateInfoEXT>
                     (&this->allocator);
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>
                     ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                       *)state,"srgb");
  uVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  pVVar3->srgb = uVar1;
  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"components");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar5,"r");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  (pVVar3->components).r = VVar2;
  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"components");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar5,"g");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  (pVVar3->components).g = VVar2;
  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"components");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar5,"b");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  (pVVar3->components).b = VVar2;
  pGVar5 = (GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            *)rapidjson::
              GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ::operator[]<char_const>
                        ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          *)state,"components");
  pGVar4 = rapidjson::
           GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
           ::operator[]<char_const>(pGVar5,"a");
  VVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::GetUint(pGVar4);
  (pVVar3->components).a = VVar2;
  *out_info = pVVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sampler_border_color_component_mapping(const Value &state, VkSamplerBorderColorComponentMappingCreateInfoEXT **out_info)
{
	auto *info = allocator.allocate_cleared<VkSamplerBorderColorComponentMappingCreateInfoEXT>();
	info->srgb = state["srgb"].GetUint();
	info->components.r = static_cast<VkComponentSwizzle>(state["components"]["r"].GetUint());
	info->components.g = static_cast<VkComponentSwizzle>(state["components"]["g"].GetUint());
	info->components.b = static_cast<VkComponentSwizzle>(state["components"]["b"].GetUint());
	info->components.a = static_cast<VkComponentSwizzle>(state["components"]["a"].GetUint());
	*out_info = info;
	return true;
}